

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.c
# Opt level: O0

size_t FSE_buildCTable_rle(FSE_CTable *ct,BYTE symbolValue)

{
  FSE_symbolCompressionTransform *symbolTT;
  void *FSCTptr;
  U16 *tableU16;
  void *ptr;
  BYTE symbolValue_local;
  FSE_CTable *ct_local;
  
  *(undefined2 *)ct = 0;
  *(ushort *)((long)ct + 2) = (ushort)symbolValue;
  *(undefined2 *)(ct + 1) = 0;
  *(undefined2 *)((long)ct + 6) = 0;
  ct[(ulong)symbolValue * 2 + 3] = 0;
  ct[(ulong)symbolValue * 2 + 2] = 0;
  return 0;
}

Assistant:

size_t FSE_buildCTable_rle (FSE_CTable* ct, BYTE symbolValue)
{
    void* ptr = ct;
    U16* tableU16 = ( (U16*) ptr) + 2;
    void* FSCTptr = (U32*)ptr + 2;
    FSE_symbolCompressionTransform* symbolTT = (FSE_symbolCompressionTransform*) FSCTptr;

    /* header */
    tableU16[-2] = (U16) 0;
    tableU16[-1] = (U16) symbolValue;

    /* Build table */
    tableU16[0] = 0;
    tableU16[1] = 0;   /* just in case */

    /* Build Symbol Transformation Table */
    symbolTT[symbolValue].deltaNbBits = 0;
    symbolTT[symbolValue].deltaFindState = 0;

    return 0;
}